

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationFastLatinBuilder::addContractionEntry
          (CollationFastLatinBuilder *this,int32_t x,int64_t cce0,int64_t cce1,UErrorCode *errorCode
          )

{
  UErrorCode *errorCode_local;
  int64_t cce1_local;
  int64_t cce0_local;
  int32_t x_local;
  CollationFastLatinBuilder *this_local;
  
  UVector64::addElement(&this->contractionCEs,(long)x,errorCode);
  UVector64::addElement(&this->contractionCEs,cce0,errorCode);
  UVector64::addElement(&this->contractionCEs,cce1,errorCode);
  addUniqueCE(this,cce0,errorCode);
  addUniqueCE(this,cce1,errorCode);
  return;
}

Assistant:

void
CollationFastLatinBuilder::addContractionEntry(int32_t x, int64_t cce0, int64_t cce1,
                                               UErrorCode &errorCode) {
    contractionCEs.addElement(x, errorCode);
    contractionCEs.addElement(cce0, errorCode);
    contractionCEs.addElement(cce1, errorCode);
    addUniqueCE(cce0, errorCode);
    addUniqueCE(cce1, errorCode);
}